

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

DropIndicatorPosition __thiscall
QAbstractItemViewPrivate::position
          (QAbstractItemViewPrivate *this,QPoint *pos,QRect *rect,QModelIndex *index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char cVar8;
  uint uVar9;
  DropIndicatorPosition DVar10;
  QPoint QVar11;
  DropIndicatorPosition DVar12;
  QRect *pQVar13;
  long in_FS_OFFSET;
  double dVar14;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->overwrite == false) {
    iVar1 = (rect->y1).m_i;
    iVar2 = (rect->y2).m_i;
    dVar14 = (double)((iVar2 - iVar1) + 1) / 5.5;
    DVar10 = (DropIndicatorPosition)
             ((double)((ulong)dVar14 & 0x8000000000000000 | (ulong)DAT_005e55c0) + dVar14);
    DVar12 = 0xc;
    if ((int)DVar10 < 0xc) {
      DVar12 = DVar10;
    }
    DVar10 = BelowItem;
    if ((int)DVar12 < 3) {
      DVar12 = DVar10;
    }
    iVar3 = (pos->yp).m_i;
    if (iVar3 - iVar1 < (int)DVar12) {
      DVar10 = AboveItem;
      goto LAB_004e4867;
    }
    pQVar13 = rect;
    if (iVar2 - iVar3 < (int)DVar12) goto LAB_004e4867;
  }
  else {
    uVar4 = rect->x1;
    uVar5 = rect->y1;
    uVar6 = rect->x2;
    uVar7 = rect->y2;
    local_48.y1.m_i = uVar5 + -1;
    local_48.x1.m_i = uVar4 + -1;
    local_48.y2.m_i = uVar7 + 1;
    local_48.x2.m_i = uVar6 + 1;
    pQVar13 = &local_48;
  }
  cVar8 = QRect::contains((QPoint *)pQVar13,SUB81(pos,0));
  if (cVar8 == '\0') {
    DVar10 = OnViewport;
  }
  else {
    uVar9 = (**(code **)(*(long *)this->model + 0x138))(this->model,index);
    DVar10 = OnItem;
    if ((uVar9 & 8) == 0) {
      iVar1 = (pos->yp).m_i;
      QVar11 = QRect::center(rect);
      DVar10 = (QVar11.yp.m_i.m_i <= iVar1) + AboveItem;
    }
  }
LAB_004e4867:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return DVar10;
}

Assistant:

QAbstractItemView::DropIndicatorPosition
QAbstractItemViewPrivate::position(const QPoint &pos, const QRect &rect, const QModelIndex &index) const
{
    QAbstractItemView::DropIndicatorPosition r = QAbstractItemView::OnViewport;
    if (!overwrite) {
        const int margin = qBound(2, qRound(qreal(rect.height()) / 5.5), 12);
        if (pos.y() - rect.top() < margin) {
            r = QAbstractItemView::AboveItem;
        } else if (rect.bottom() - pos.y() < margin) {
            r = QAbstractItemView::BelowItem;
        } else if (rect.contains(pos, true)) {
            r = QAbstractItemView::OnItem;
        }
    } else {
        QRect touchingRect = rect;
        touchingRect.adjust(-1, -1, 1, 1);
        if (touchingRect.contains(pos, false)) {
            r = QAbstractItemView::OnItem;
        }
    }

    if (r == QAbstractItemView::OnItem && (!(model->flags(index) & Qt::ItemIsDropEnabled)))
        r = pos.y() < rect.center().y() ? QAbstractItemView::AboveItem : QAbstractItemView::BelowItem;

    return r;
}